

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

int test_double(int verbose)

{
  double dVar1;
  int local_1c;
  double dStack_18;
  int pass;
  double x;
  int verbose_local;
  
  local_1c = 1;
  if (verbose != 0) {
    printf("  sizeof(double) = %2u\n",8);
  }
  dStack_18 = 1.0;
  while( true ) {
    dVar1 = dstore(dStack_18 / 2.0 + 1.0);
    if ((dVar1 == 1.0) && (!NAN(dVar1))) break;
    dStack_18 = dStack_18 / 2.0;
  }
  if (verbose != 0) {
    printf("  machine epsilon = %13.5le ",dStack_18);
  }
  dVar1 = fppow2(-0x34);
  if ((dStack_18 != dVar1) || (NAN(dStack_18) || NAN(dVar1))) {
    printf("[not IEEE 754 conformant] !!\n");
    local_1c = 0;
  }
  else if (verbose != 0) {
    printf("[IEEE 754 64-bit macheps]\n");
  }
  dStack_18 = 1.0;
  while( true ) {
    dVar1 = dstore(dStack_18 / 2.0);
    if ((dVar1 == 0.0) && (!NAN(dVar1))) break;
    dStack_18 = dStack_18 / 2.0;
  }
  dVar1 = fppow2(-0x432);
  if ((dStack_18 != dVar1) || (NAN(dStack_18) || NAN(dVar1))) {
    dVar1 = fppow2(-0x3fe);
    if ((dStack_18 != dVar1) || (NAN(dStack_18) || NAN(dVar1))) {
      printf("[not IEEE 754 conformant] !!\n");
      local_1c = 0;
    }
  }
  return local_1c;
}

Assistant:

int test_double(int verbose)
{
  double x;
  int pass = 1;

  // (void)printf("double:\n");
  if (verbose) {
    (void)printf("  sizeof(double) = %2u\n", (unsigned int)sizeof(double));
#ifdef CPU86  // <float.h>
    (void)printf("  DBL_MANT_DIG = %2d\n", DBL_MANT_DIG);
#endif
  }

  x = 1.0;
  while (dstore(1.0 + x/2.0) != 1.0)
    x /= 2.0;
  if (verbose) 
    (void)printf("  machine epsilon = %13.5le ", x);

  if (x == (double)fppow2(-52)) {
    if (verbose)
      (void)printf("[IEEE 754 64-bit macheps]\n");
  } else {
    (void)printf("[not IEEE 754 conformant] !!\n");
    pass = 0;
  }

  x = 1.0;
  while (dstore(x / 2.0) != 0.0)
    x /= 2.0;
  //if (verbose)
  //  (void)printf("  smallest positive number = %13.5le ", x);

  if (x == (double)fppow2(-1074)) {
    //if (verbose)
    //  (void)printf("[smallest 64-bit subnormal]\n");
  } else if (x == (double)fppow2(-1022)) {
    //if (verbose)
    //  (void)printf("[smallest 64-bit normal]\n");
  } else {
    (void)printf("[not IEEE 754 conformant] !!\n");
    pass = 0;
  }

  return pass;
}